

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

void update_equip_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  
  t = Term;
  Term_activate((term *)user);
  if (flip_inven == false) {
    show_equip(L'\t',(item_tester)0x0);
  }
  else {
    show_inven(L'\v',(item_tester)0x0);
  }
  Term_fresh();
  Term_activate(t);
  return;
}

Assistant:

static void update_equip_subwindow(game_event_type type, game_event_data *data,
				   void *user)
{
	term *old = Term;
	term *inv_term = user;

	/* Activate */
	Term_activate(inv_term);

	if (!flip_inven)
		show_equip(OLIST_WINDOW | OLIST_WEIGHT, NULL);
	else
		show_inven(OLIST_WINDOW | OLIST_WEIGHT | OLIST_QUIVER, NULL);

	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}